

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

void __thiscall coro_io::io_context_pool::run(io_context_pool *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t __cpu;
  ulong uVar4;
  size_t i;
  undefined1 local_da;
  bool has_run_or_stop;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> threads;
  cpu_set_t cpuset;
  
  has_run_or_stop = false;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->has_run_or_stop_,&has_run_or_stop,true,seq_cst);
  if (bVar1) {
    threads.
    super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    threads.
    super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.
    super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->io_contexts_).
                              super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->io_contexts_).
                              super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      std::
      make_shared<std::thread,coro_io::io_context_pool::run()::_lambda(std::shared_ptr<asio::io_context>)_1_,std::shared_ptr<asio::io_context>&>
                ((anon_class_1_0_00000001_for__M_head_impl *)&cpuset,
                 (shared_ptr<asio::io_context> *)&local_da);
      std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
      emplace_back<std::shared_ptr<std::thread>>
                ((vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>
                  *)&threads,(shared_ptr<std::thread> *)&cpuset);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(cpuset.__bits + 1));
      if (this->cpu_affinity_ == true) {
        cpuset.__bits[0xe] = 0;
        cpuset.__bits[0xf] = 0;
        cpuset.__bits[0xc] = 0;
        cpuset.__bits[0xd] = 0;
        cpuset.__bits[10] = 0;
        cpuset.__bits[0xb] = 0;
        cpuset.__bits[8] = 0;
        cpuset.__bits[9] = 0;
        cpuset.__bits[6] = 0;
        cpuset.__bits[7] = 0;
        cpuset.__bits[4] = 0;
        cpuset.__bits[5] = 0;
        cpuset.__bits[2] = 0;
        cpuset.__bits[3] = 0;
        cpuset.__bits[0] = 0;
        cpuset.__bits[1] = 0;
        if (uVar4 < 0x400) {
          cpuset.__bits[uVar4 >> 6] = cpuset.__bits[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
        }
        iVar2 = pthread_setaffinity_np
                          (((threads.
                             super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].
                             super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           _M_id)._M_thread,0x80,(cpu_set_t *)&cpuset);
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error calling pthread_setaffinity_np: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
          std::operator<<(poVar3,"\n");
        }
      }
    }
    for (uVar4 = 0;
        uVar4 < (ulong)((long)threads.
                              super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)threads.
                              super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      std::thread::join();
    }
    std::promise<void>::set_value(&this->promise_);
    std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
    ~vector(&threads);
  }
  return;
}

Assistant:

void run() {
    bool has_run_or_stop = false;
    bool ok = has_run_or_stop_.compare_exchange_strong(has_run_or_stop, true);
    if (!ok) {
      return;
    }

    std::vector<std::shared_ptr<std::thread>> threads;
    for (std::size_t i = 0; i < io_contexts_.size(); ++i) {
      threads.emplace_back(std::make_shared<std::thread>(
          [](io_context_ptr svr) {
            auto ctx = get_current();
            *ctx = svr.get();
            svr->run();
          },
          io_contexts_[i]));

#ifdef __linux__
      if (cpu_affinity_) {
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(i, &cpuset);
        int rc = pthread_setaffinity_np(threads.back()->native_handle(),
                                        sizeof(cpu_set_t), &cpuset);
        if (rc != 0) {
          std::cerr << "Error calling pthread_setaffinity_np: " << rc << "\n";
        }
      }
#endif
    }

    for (std::size_t i = 0; i < threads.size(); ++i) {
      threads[i]->join();
    }
    promise_.set_value();
  }